

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

void __thiscall IPStats::SubmitCborPacket(IPStats *this,cdns *cdns_ctx,size_t packet_id)

{
  size_t ipaddr_length;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  bool local_3e1;
  size_type sStack_3e0;
  bool stored;
  size_t cid;
  int local_3d0;
  int rr_type;
  int rr_class;
  uint32_t local_3bc;
  uint8_t *puStack_3b8;
  uint32_t q_name_length;
  uint8_t *q_name;
  size_t nid;
  size_t addrid;
  cdns_query_signature *q_sig;
  cdns_query *query;
  IPStatsRecord ipsr;
  bool is_valid;
  size_t packet_id_local;
  cdns *cdns_ctx_local;
  IPStats *this_local;
  
  ipsr.HashNext._7_1_ = 1;
  IPStatsRecord::IPStatsRecord((IPStatsRecord *)&query);
  q_sig = (cdns_query_signature *)
          std::vector<cdns_query,_std::allocator<cdns_query>_>::operator[]
                    (&(cdns_ctx->block).queries,packet_id);
  addrid = 0;
  if (cdns_ctx->index_offset <= ((reference)q_sig)->client_address_index) {
    nid = (long)((reference)q_sig)->client_address_index - (long)cdns_ctx->index_offset;
    pvVar2 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                       (&(cdns_ctx->block).tables.addresses,nid);
    ipaddr_length = pvVar2->l;
    pvVar2 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                       (&(cdns_ctx->block).tables.addresses,nid);
    bVar1 = IPStatsRecord::SetIP((IPStatsRecord *)&query,ipaddr_length,pvVar2->v);
    if (!bVar1) {
      ipsr.HashNext._7_1_ = 0;
    }
  }
  if ((ipsr.HashNext._7_1_ & 1) != 0) {
    if (cdns_ctx->index_offset <= q_sig->qr_sig_flags) {
      addrid = (size_t)std::vector<cdns_query_signature,_std::allocator<cdns_query_signature>_>::
                       operator[](&(cdns_ctx->block).tables.q_sigs,
                                  (long)q_sig->qr_sig_flags - (long)cdns_ctx->index_offset);
    }
    ipsr.ip_addr._8_8_ = ipsr.ip_addr._8_8_ + 1;
    if ((addrid == 0) || (q_sig->query_rcode < cdns_ctx->index_offset)) {
      ipsr.HashNext._7_1_ = 0;
    }
    else {
      q_name = (uint8_t *)((long)q_sig->query_rcode - (long)cdns_ctx->index_offset);
      pvVar2 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                         (&(cdns_ctx->block).tables.name_rdata,(size_type)q_name);
      puStack_3b8 = pvVar2->v;
      pvVar2 = std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::operator[]
                         (&(cdns_ctx->block).tables.name_rdata,(size_type)q_name);
      local_3bc = (uint32_t)pvVar2->l;
      ipsr.HashNext._7_1_ =
           IPStatsRecord::SetQName((IPStatsRecord *)&query,puStack_3b8,local_3bc,this);
    }
  }
  if ((ipsr.HashNext._7_1_ & 1) != 0) {
    ipsr.HashNext._7_1_ =
         IPStatsRecord::SetTime
                   ((IPStatsRecord *)&query,(cdns_ctx->block).preamble.earliest_time_sec);
  }
  if ((ipsr.HashNext._7_1_ & 1) != 0) {
    local_3d0 = 0;
    cid._4_4_ = 0;
    if ((addrid != 0) && (cdns_ctx->index_offset <= q_sig->query_rcode)) {
      sStack_3e0 = (long)*(int *)(addrid + 0x28) - (long)cdns_ctx->index_offset;
      pvVar3 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                         (&(cdns_ctx->block).tables.class_ids,sStack_3e0);
      local_3d0 = pvVar3->rr_class;
      pvVar3 = std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::operator[]
                         (&(cdns_ctx->block).tables.class_ids,sStack_3e0);
      cid._4_4_ = pvVar3->rr_type;
      ipsr.HashNext._7_1_ = IPStatsRecord::SetRR((IPStatsRecord *)&query,cid._4_4_,local_3d0);
    }
  }
  if ((ipsr.HashNext._7_1_ & 1) != 0) {
    local_3e1 = false;
    BinHash<IPStatsRecord>::InsertOrAdd(&this->ip_records,(IPStatsRecord *)&query,true,&local_3e1);
  }
  IPStatsRecord::~IPStatsRecord((IPStatsRecord *)&query);
  return;
}

Assistant:

void IPStats::SubmitCborPacket(cdns* cdns_ctx, size_t packet_id)
{
    /* TODO: add to database. */
    bool is_valid = true;
    IPStatsRecord ipsr;
    cdns_query* query = &cdns_ctx->block.queries[packet_id];
    cdns_query_signature* q_sig = NULL;

    if (query->client_address_index >= cdns_ctx->index_offset){
        size_t addrid = (size_t)query->client_address_index - cdns_ctx->index_offset;
        if (!ipsr.SetIP(cdns_ctx->block.tables.addresses[addrid].l, cdns_ctx->block.tables.addresses[addrid].v)) {
            /* malformed IP address. Cannot do anything with that record. */
            is_valid = false;
        }
    }

    if (is_valid) {
        if (query->query_signature_index >= cdns_ctx->index_offset) {
            q_sig = &cdns_ctx->block.tables.q_sigs[(size_t)query->query_signature_index - cdns_ctx->index_offset];
        }


        ipsr.query_volume += 1;

        /* Queried name and response type */
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            uint8_t* q_name = cdns_ctx->block.tables.name_rdata[nid].v;
            uint32_t q_name_length = (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l;
            is_valid = ipsr.SetQName(q_name, q_name_length, this);
        }
        else {
            is_valid = false;
        }
    }

    /* Set date */
    if (is_valid) {
        /* Find hour and date */
        is_valid = ipsr.SetTime(cdns_ctx->block.preamble.earliest_time_sec);
    }

    /* TODO: Set RR */
    if (is_valid) {
        /* Find qr_class, so leak analysis can distinguish between Internet and Chaos */
        int rr_class = 0;
        int rr_type = 0;
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
            rr_type = cdns_ctx->block.tables.class_ids[cid].rr_type;
            is_valid = ipsr.SetRR(rr_type, rr_class);
        }
    }

    /* If the packet is valid, add the record to the table of addresses */
    if (is_valid) {
        bool stored = false;
        this->ip_records.InsertOrAdd(&ipsr, true, &stored);
    }
}